

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O1

bool google::protobuf::compiler::annotation_test_util::DecodeMetadata
               (string *path,GeneratedCodeInfo *info)

{
  bool bVar1;
  Nonnull<const_char_*> failure_msg;
  string data;
  ArrayInputStream input;
  string local_60;
  ArrayInputStream local_40;
  
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  File::ReadFileToString((File *)&local_40,path,&local_60,false);
  if ((StatusRep *)local_40.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream == (StatusRep *)0x1)
  {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                            ((Nonnull<const_absl::Status_*>)&local_40,
                             "File::GetContents(path, &data, true) is OK");
  }
  if (((ulong)local_40.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref
              ((StatusRep *)local_40.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream);
  }
  if ((StatusRep *)local_40.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream == (StatusRep *)0x1)
  {
    io::ArrayInputStream::ArrayInputStream
              (&local_40,local_60._M_dataplus._M_p,(int)local_60._M_string_length,-1);
    bVar1 = MessageLite::ParseFromZeroCopyStream
                      ((MessageLite *)info,&local_40.super_ZeroCopyInputStream);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
    return bVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/annotation_test_util.cc"
             ,0x4c,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

bool DecodeMetadata(const std::string& path, GeneratedCodeInfo* info) {
  std::string data;
  ABSL_CHECK_OK(File::GetContents(path, &data, true));
  io::ArrayInputStream input(data.data(), data.size());
  return info->ParseFromZeroCopyStream(&input);
}